

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O0

time_exactness_t parse_time_exactness(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if ((iVar1 != 0) && (iVar1 = strcmp(value,""), iVar1 != 0)) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      return TE_EXACT;
    }
    return TE_NOT_SET;
  }
  return TE_NOT_EXACT;
}

Assistant:

time_exactness_t parse_time_exactness(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return TE_NOT_EXACT;
    else if (strcmp(value, "1") == 0)
        return TE_EXACT;
    else
        return TE_NOT_SET;
}